

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

int al_get_new_display_refresh_rate(void)

{
  int iVar1;
  long *plVar2;
  
  plVar2 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar2 == 0) {
    *plVar2 = (long)(plVar2 + 1);
    initialize_tls_values((thread_local_state *)(plVar2 + 1));
  }
  if (*plVar2 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = *(int *)(*plVar2 + 4);
  }
  return iVar1;
}

Assistant:

int al_get_new_display_refresh_rate(void)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return 0;
   return tls->new_display_refresh_rate;
}